

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseDecltype(State *state)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ParseState copy;
  
  iVar6 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar6 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar6) {
    bVar4 = false;
    goto LAB_0026613b;
  }
  iVar6 = (state->parse_state).mangled_idx;
  iVar1 = (state->parse_state).out_cur_idx;
  iVar2 = (state->parse_state).prev_name_idx;
  uVar3 = *(undefined4 *)&(state->parse_state).field_0xc;
  bVar5 = ParseOneCharToken(state,'D');
  if (bVar5) {
    bVar5 = ParseCharClass(state,"tT");
    if (!bVar5) goto LAB_00266129;
    bVar5 = ParseExpression(state);
    if (!bVar5) goto LAB_00266129;
    bVar5 = ParseOneCharToken(state,'E');
    bVar4 = true;
    if (!bVar5) goto LAB_00266129;
  }
  else {
LAB_00266129:
    (state->parse_state).mangled_idx = iVar6;
    (state->parse_state).out_cur_idx = iVar1;
    (state->parse_state).prev_name_idx = iVar2;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar3;
    bVar4 = false;
  }
  iVar6 = state->recursion_depth + -1;
LAB_0026613b:
  state->recursion_depth = iVar6;
  return bVar4;
}

Assistant:

static bool ParseDecltype(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "tT") &&
      ParseExpression(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}